

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O1

int MPIABI_Ireduce(void *sendbuf,void *recvbuf,int count,MPIABI_Datatype datatype,MPIABI_Op op,
                  int root,MPIABI_Comm comm,MPIABI_Request *request)

{
  int iVar1;
  
  iVar1 = MPI_Ireduce();
  return iVar1;
}

Assistant:

int MPIABI_Ireduce(
  const void * sendbuf,
  void * recvbuf,
  int count,
  MPIABI_Datatype datatype,
  MPIABI_Op op,
  int root,
  MPIABI_Comm comm,
  MPIABI_Request * request
) {
  return MPI_Ireduce(
    sendbuf,
    recvbuf,
    count,
    (MPI_Datatype)(WPI_Datatype)datatype,
    (MPI_Op)(WPI_Op)op,
    root,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Request *)(WPI_RequestPtr)request
  );
}